

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O1

void __thiscall HModel::scaleModel(HModel *this)

{
  int iVar1;
  pointer piVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer piVar5;
  pointer pdVar6;
  pointer pdVar7;
  pointer pdVar8;
  bool bVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  int search_count;
  int iVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double inf;
  vector<double,_std::allocator<double>_> rowMin;
  vector<double,_std::allocator<double>_> rowMax;
  allocator_type local_71;
  value_type_conflict1 local_70;
  value_type_conflict1 local_68;
  vector<double,_std::allocator<double>_> local_60;
  vector<double,_std::allocator<double>_> local_48;
  
  if (this->intOption[2] != 0) {
    local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)&DAT_3ff0000000000000;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              (&this->colScale,(long)this->numCol,(value_type_conflict1 *)&local_60);
    local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)&DAT_3ff0000000000000;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              (&this->rowScale,(long)this->numRow,(value_type_conflict1 *)&local_60);
    local_68 = 1e+200;
    iVar17 = this->numCol;
    lVar12 = (long)(this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar17];
    if (0 < lVar12) {
      lVar15 = 0;
      dVar19 = 0.0;
      dVar20 = 1e+200;
      do {
        dVar18 = ABS((this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar15]);
        dVar21 = dVar18;
        if (dVar20 <= dVar18) {
          dVar21 = dVar20;
        }
        if (dVar18 <= dVar19) {
          dVar18 = dVar19;
        }
        lVar15 = lVar15 + 1;
        dVar19 = dVar18;
        dVar20 = dVar21;
      } while (lVar12 != lVar15);
      if ((dVar21 < 0.2) || (5.0 < dVar18)) {
        if (iVar17 < 1) {
          bVar9 = false;
        }
        else {
          lVar12 = 0;
          dVar19 = 1e+200;
          do {
            dVar20 = (this->colCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar12] * (double)this->objSense;
            if (((dVar20 != 0.0) || (dVar18 = dVar19, NAN(dVar20))) &&
               (dVar18 = ABS(dVar20), dVar19 <= ABS(dVar20))) {
              dVar18 = dVar19;
            }
            lVar12 = lVar12 + 1;
            dVar19 = dVar18;
          } while (iVar17 != lVar12);
          bVar9 = dVar18 < 0.1;
        }
        std::vector<double,_std::allocator<double>_>::vector
                  (&local_60,(long)this->numRow,&local_68,(allocator_type *)&local_48);
        local_70 = 1e-200;
        std::vector<double,_std::allocator<double>_>::vector
                  (&local_48,(long)this->numRow,&local_70,&local_71);
        iVar17 = 0;
        do {
          if (0 < this->numCol) {
            lVar12 = 0;
            do {
              dVar20 = (double)this->objSense *
                       (this->colCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar12];
              dVar19 = 1e+200;
              dVar18 = 1e-200;
              if ((bool)(dVar20 != 0.0 & bVar9)) {
                dVar18 = ABS(dVar20);
                dVar19 = dVar18;
                if (1e+200 <= dVar18) {
                  dVar19 = 1e+200;
                }
                if (dVar18 <= 1e-200) {
                  dVar18 = 1e-200;
                }
              }
              piVar2 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              iVar10 = piVar2[lVar12];
              lVar15 = (long)iVar10;
              iVar1 = piVar2[lVar12 + 1];
              if (iVar10 < iVar1) {
                dVar20 = dVar19;
                do {
                  dVar21 = ABS((this->Avalue).super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data._M_start[lVar15]) *
                           (this->rowScale).super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_start
                           [(this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar15]];
                  dVar19 = dVar21;
                  if (dVar20 <= dVar21) {
                    dVar19 = dVar20;
                  }
                  if (dVar21 <= dVar18) {
                    dVar21 = dVar18;
                  }
                  dVar18 = dVar21;
                  lVar15 = lVar15 + 1;
                  dVar20 = dVar19;
                } while (iVar1 != lVar15);
              }
              dVar19 = dVar19 * dVar18;
              if (dVar19 < 0.0) {
                dVar19 = sqrt(dVar19);
              }
              else {
                dVar19 = SQRT(dVar19);
              }
              lVar15 = lVar12 + 1;
              pdVar3 = (this->colScale).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
              pdVar3[lVar12] = 1.0 / dVar19;
              piVar2 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              iVar10 = piVar2[lVar12];
              lVar13 = (long)iVar10;
              iVar1 = piVar2[lVar15];
              if (iVar10 < iVar1) {
                piVar2 = (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
                pdVar4 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
                do {
                  dVar19 = ABS(pdVar4[lVar13]) * pdVar3[lVar12];
                  iVar10 = piVar2[lVar13];
                  dVar20 = dVar19;
                  if (local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[iVar10] <= dVar19) {
                    dVar20 = local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[iVar10];
                  }
                  local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar10] = dVar20;
                  if (dVar19 <= local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_start[iVar10]) {
                    dVar19 = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[iVar10];
                  }
                  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar10] = dVar19;
                  lVar13 = lVar13 + 1;
                } while (iVar1 != lVar13);
              }
              lVar12 = lVar15;
            } while (lVar15 < this->numCol);
          }
          iVar10 = this->numRow;
          if (0 < iVar10) {
            lVar12 = 0;
            do {
              dVar19 = local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar12] *
                       local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar12];
              if (dVar19 < 0.0) {
                dVar19 = sqrt(dVar19);
              }
              else {
                dVar19 = SQRT(dVar19);
              }
              (this->rowScale).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar12] = 1.0 / dVar19;
              lVar12 = lVar12 + 1;
              iVar10 = this->numRow;
            } while (lVar12 < iVar10);
          }
          std::vector<double,_std::allocator<double>_>::_M_fill_assign
                    (&local_60,(long)iVar10,&local_68);
          local_70 = 1e-200;
          std::vector<double,_std::allocator<double>_>::_M_fill_assign
                    (&local_48,(long)this->numRow,&local_70);
          iVar17 = iVar17 + 1;
        } while (iVar17 != 6);
        if (0 < this->numCol) {
          lVar12 = 0;
          do {
            dVar19 = log((this->colScale).super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_start[lVar12]);
            dVar19 = floor(dVar19 / 0.6931471805599453 + 0.5);
            dVar19 = exp2(dVar19);
            (this->colScale).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar12] = dVar19;
            lVar12 = lVar12 + 1;
          } while (lVar12 < this->numCol);
        }
        uVar11 = this->numRow;
        if (0 < (int)uVar11) {
          lVar12 = 0;
          do {
            dVar19 = log((this->rowScale).super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_start[lVar12]);
            dVar19 = floor(dVar19 / 0.6931471805599453 + 0.5);
            dVar19 = exp2(dVar19);
            (this->rowScale).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar12] = dVar19;
            lVar12 = lVar12 + 1;
            uVar11 = this->numRow;
          } while (lVar12 < (int)uVar11);
        }
        iVar17 = this->numCol;
        lVar12 = (long)iVar17;
        if (0 < lVar12) {
          piVar2 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar5 = (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar3 = (this->colScale).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar4 = (this->rowScale).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar6 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar15 = 0;
          do {
            iVar10 = piVar2[lVar15];
            lVar13 = (long)iVar10;
            iVar1 = piVar2[lVar15 + 1];
            if (iVar10 < iVar1) {
              do {
                pdVar6[lVar13] = pdVar3[lVar15] * pdVar4[piVar5[lVar13]] * pdVar6[lVar13];
                lVar13 = lVar13 + 1;
              } while (iVar1 != lVar13);
            }
            lVar15 = lVar15 + 1;
          } while (lVar15 != lVar12);
        }
        if (0 < iVar17) {
          pdVar3 = (this->colCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar4 = (this->colLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar6 = (this->colScale).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar7 = (this->colUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar15 = 0;
          do {
            dVar19 = pdVar4[lVar15];
            dVar20 = 1.0;
            if ((dVar19 != -1e+200) || (NAN(dVar19))) {
              dVar20 = pdVar6[lVar15];
            }
            pdVar4[lVar15] = dVar19 / dVar20;
            dVar19 = pdVar7[lVar15];
            dVar20 = 1.0;
            if ((dVar19 != 1e+200) || (NAN(dVar19))) {
              dVar20 = pdVar6[lVar15];
            }
            pdVar7[lVar15] = dVar19 / dVar20;
            pdVar3[lVar15] = pdVar6[lVar15] * pdVar3[lVar15];
            lVar15 = lVar15 + 1;
          } while (lVar12 != lVar15);
        }
        uVar14 = (ulong)uVar11;
        if (0 < (int)uVar11) {
          pdVar3 = (this->rowLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar4 = (this->rowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar6 = (this->rowScale).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar16 = 0;
          do {
            dVar19 = pdVar3[uVar16];
            dVar20 = 1.0;
            if ((dVar19 != -1e+200) || (NAN(dVar19))) {
              dVar20 = pdVar6[uVar16];
            }
            pdVar3[uVar16] = dVar19 * dVar20;
            dVar19 = pdVar4[uVar16];
            dVar20 = 1.0;
            if ((dVar19 != 1e+200) || (NAN(dVar19))) {
              dVar20 = pdVar6[uVar16];
            }
            pdVar4[uVar16] = dVar19 * dVar20;
            uVar16 = uVar16 + 1;
          } while (uVar14 != uVar16);
        }
        if (this->impliedBoundsPresolve == true) {
          if (0 < iVar17) {
            pdVar3 = (this->primalColLowerImplied).
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar4 = (this->colScale).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar6 = (this->primalColUpperImplied).
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar7 = (this->dualColLowerImplied).super__Vector_base<double,_std::allocator<double>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pdVar8 = (this->dualColUpperImplied).super__Vector_base<double,_std::allocator<double>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            lVar15 = 0;
            do {
              dVar19 = pdVar3[lVar15];
              dVar20 = 1.0;
              if ((dVar19 != -1e+200) || (NAN(dVar19))) {
                dVar20 = pdVar4[lVar15];
              }
              pdVar3[lVar15] = dVar19 / dVar20;
              dVar19 = pdVar6[lVar15];
              dVar20 = 1.0;
              if ((dVar19 != 1e+200) || (NAN(dVar19))) {
                dVar20 = pdVar4[lVar15];
              }
              pdVar6[lVar15] = dVar19 / dVar20;
              dVar19 = pdVar7[lVar15];
              dVar20 = 1.0;
              if ((dVar19 != -1e+200) || (NAN(dVar19))) {
                dVar20 = pdVar4[lVar15];
              }
              pdVar7[lVar15] = dVar19 * dVar20;
              dVar19 = pdVar8[lVar15];
              dVar20 = 1.0;
              if ((dVar19 != 1e+200) || (NAN(dVar19))) {
                dVar20 = pdVar4[lVar15];
              }
              pdVar8[lVar15] = dVar19 * dVar20;
              lVar15 = lVar15 + 1;
            } while (lVar12 != lVar15);
          }
          if (0 < (int)uVar11) {
            pdVar3 = (this->primalRowLowerImplied).
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar4 = (this->rowScale).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar6 = (this->primalRowUpperImplied).
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar7 = (this->dualRowLowerImplied).super__Vector_base<double,_std::allocator<double>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pdVar8 = (this->dualRowUpperImplied).super__Vector_base<double,_std::allocator<double>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar16 = 0;
            do {
              dVar19 = pdVar3[uVar16];
              dVar20 = 1.0;
              if ((dVar19 != -1e+200) || (NAN(dVar19))) {
                dVar20 = pdVar4[uVar16];
              }
              pdVar3[uVar16] = dVar19 * dVar20;
              dVar19 = pdVar6[uVar16];
              dVar20 = 1.0;
              if ((dVar19 != 1e+200) || (NAN(dVar19))) {
                dVar20 = pdVar4[uVar16];
              }
              pdVar6[uVar16] = dVar19 * dVar20;
              dVar19 = pdVar7[uVar16];
              dVar20 = 1.0;
              if ((dVar19 != -1e+200) || (NAN(dVar19))) {
                dVar20 = pdVar4[uVar16];
              }
              pdVar7[uVar16] = dVar19 / dVar20;
              dVar19 = pdVar8[uVar16];
              dVar20 = 1.0;
              if ((dVar19 != 1e+200) || (NAN(dVar19))) {
                dVar20 = pdVar4[uVar16];
              }
              pdVar8[uVar16] = dVar19 / dVar20;
              uVar16 = uVar16 + 1;
            } while (uVar14 != uVar16);
          }
        }
        if (this->mlFg_haveSavedBounds != 0) {
          if (0 < iVar17) {
            pdVar3 = (this->SvColLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar4 = (this->colScale).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar6 = (this->SvColUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            lVar15 = 0;
            do {
              dVar19 = pdVar3[lVar15];
              if (-1e+200 < dVar19) {
                pdVar3[lVar15] = dVar19 * pdVar4[lVar15];
              }
              dVar19 = pdVar6[lVar15];
              if (dVar19 < 1e+200) {
                pdVar6[lVar15] = dVar19 * pdVar4[lVar15];
              }
              lVar15 = lVar15 + 1;
            } while (lVar12 != lVar15);
          }
          if (0 < (int)uVar11) {
            pdVar3 = (this->SvRowLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar4 = (this->rowScale).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar6 = (this->SvRowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar16 = 0;
            do {
              dVar19 = pdVar3[uVar16];
              if (-1e+200 < dVar19) {
                pdVar3[uVar16] = dVar19 * pdVar4[uVar16];
              }
              dVar19 = pdVar6[uVar16];
              if (dVar19 < 1e+200) {
                pdVar6[uVar16] = dVar19 * pdVar4[uVar16];
              }
              uVar16 = uVar16 + 1;
            } while (uVar14 != uVar16);
          }
        }
        mlFg_Update(this,this->mlFg_action_ScaleLP);
        if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
      }
    }
  }
  return;
}

Assistant:

void HModel::scaleModel() {
  if (intOption[INTOPT_SCALE_FLAG] == 0) {
    //    printf("NOT SCALING MATRIX\n");
    return;}
  
  // Reset all scaling to 1
  colScale.assign(numCol, 1);
  rowScale.assign(numRow, 1);

    // Find out min0 / max0, skip on if in [0.2, 5]
    const double inf = HSOL_CONST_INF;
    double min0 = inf, max0 = 0;
    for (int k = 0, AnX = Astart[numCol]; k < AnX; k++) {
        double value = fabs(Avalue[k]);
        min0 = min(min0, value);
        max0 = max(max0, value);
    }
    if (min0 >= 0.2 && max0 <= 5)
        return;

    // See if we want to include cost include if min-cost < 0.1
    double minc = inf;
    for (int i = 0; i < numCol; i++) {
      double sense_col_cost = objSense*colCost[i];
      if (sense_col_cost)
	minc = min(minc, fabs(sense_col_cost));
    }
    bool doCost = minc < 0.1;

    // Search up to 6 times
    vector<double> rowMin(numRow, inf);
    vector<double> rowMax(numRow, 1 / inf);
    for (int search_count = 0; search_count < 6; search_count++) {
        // Find column scale, prepare row data
        for (int iCol = 0; iCol < numCol; iCol++) {
            // For column scale (find)
            double colMin = inf;
            double colMax = 1 / inf;
	    double sense_col_cost = objSense*colCost[iCol];
            double myCost = fabs(sense_col_cost);
            if (doCost && myCost != 0)
                colMin = min(colMin, myCost), colMax = max(colMax, myCost);
            for (int k = Astart[iCol]; k < Astart[iCol + 1]; k++) {
                double value = fabs(Avalue[k]) * rowScale[Aindex[k]];
                colMin = min(colMin, value), colMax = max(colMax, value);
            }
            colScale[iCol] = 1 / sqrt(colMin * colMax);

            // For row scale (only collect)
            for (int k = Astart[iCol]; k < Astart[iCol + 1]; k++) {
                int iRow = Aindex[k];
                double value = fabs(Avalue[k]) * colScale[iCol];
                rowMin[iRow] = min(rowMin[iRow], value);
                rowMax[iRow] = max(rowMax[iRow], value);
            }
        }

        // For row scale (find)
        for (int iRow = 0; iRow < numRow; iRow++)
            rowScale[iRow] = 1 / sqrt(rowMin[iRow] * rowMax[iRow]);
        rowMin.assign(numRow, inf);
        rowMax.assign(numRow, 1 / inf);
    }

    // Make it numerical better
    const double ln2 = log(2.0);
    for (int iCol = 0; iCol < numCol; iCol++)
        colScale[iCol] = pow(2.0, floor(log(colScale[iCol]) / ln2 + 0.5));
    for (int iRow = 0; iRow < numRow; iRow++)
        rowScale[iRow] = pow(2.0, floor(log(rowScale[iRow]) / ln2 + 0.5));

    // Apply scaling to matrix and bounds
    for (int iCol = 0; iCol < numCol; iCol++)
        for (int k = Astart[iCol]; k < Astart[iCol + 1]; k++)
            Avalue[k] *= (colScale[iCol] * rowScale[Aindex[k]]);

    for (int iCol = 0; iCol < numCol; iCol++) {
        colLower[iCol] /= colLower[iCol] == -inf ? 1 : colScale[iCol];
        colUpper[iCol] /= colUpper[iCol] == +inf ? 1 : colScale[iCol];
        colCost[iCol] *= colScale[iCol];
    }
    for (int iRow = 0; iRow < numRow; iRow++) {
        rowLower[iRow] *= rowLower[iRow] == -inf ? 1 : rowScale[iRow];
        rowUpper[iRow] *= rowUpper[iRow] == +inf ? 1 : rowScale[iRow];
    }
	if (impliedBoundsPresolve) {
		for (int iCol = 0; iCol < numCol; iCol++) {
			primalColLowerImplied[iCol] /= primalColLowerImplied[iCol] == -inf ? 1 : colScale[iCol];
			primalColUpperImplied[iCol] /= primalColUpperImplied[iCol] == +inf ? 1 : colScale[iCol];
			dualColLowerImplied[iCol] *= dualColLowerImplied[iCol] == -inf ? 1 : colScale[iCol];
			dualColUpperImplied[iCol] *= dualColUpperImplied[iCol] == +inf ? 1 : colScale[iCol];
		}
		for (int iRow = 0; iRow < numRow; iRow++) {
			primalRowLowerImplied[iRow] *= primalRowLowerImplied[iRow] == -inf ? 1 : rowScale[iRow];
			primalRowUpperImplied[iRow] *= primalRowUpperImplied[iRow] == +inf ? 1 : rowScale[iRow];
			dualRowLowerImplied[iRow] /= dualRowLowerImplied[iRow] == -inf ? 1 : rowScale[iRow];
			dualRowUpperImplied[iRow] /= dualRowUpperImplied[iRow] == +inf ? 1 : rowScale[iRow];
		}
	}

	if (mlFg_haveSavedBounds) {
	  //Model has saved bounds which must also be scaled so they are consistent when recovered
	  for (int col = 0; col < numCol; col++) {
	    if (!hsol_isInfinity(-SvColLower[col])) SvColLower[col] *= colScale[col];
	    if (!hsol_isInfinity( SvColUpper[col])) SvColUpper[col] *= colScale[col];
	  }
	  for (int row = 0; row < numRow; row++) {
	    if (!hsol_isInfinity(-SvRowLower[row])) SvRowLower[row] *= rowScale[row];
	    if (!hsol_isInfinity( SvRowUpper[row])) SvRowUpper[row] *= rowScale[row];
	  }
	}
    //Deduce the consequences of scaling the LP
    mlFg_Update(mlFg_action_ScaleLP);
}